

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O0

int duckdb_shell_sqlite3_create_function
              (sqlite3 *db,char *zFunctionName,int nArg,int eTextRep,void *pApp,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xFunc,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep,
              _func_void_sqlite3_context_ptr *xFinal)

{
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *this;
  pointer this_00;
  type other;
  int in_EDX;
  LogicalType *in_RSI;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  idx_t i;
  vector<duckdb::LogicalType,_true> argv_types;
  LogicalType varargs;
  scalar_function_t udf_sqlite3;
  string fname;
  LogicalType *in_stack_00000338;
  ClientContext *in_stack_00000340;
  scalar_function_t *in_stack_00000348;
  LogicalType *in_stack_00000350;
  vector<duckdb::LogicalType,_true> *in_stack_00000358;
  string *in_stack_00000360;
  LogicalType *in_stack_fffffffffffffe48;
  LogicalType *in_stack_fffffffffffffe50;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe68;
  LogicalTypeId LVar2;
  undefined1 *puVar1;
  allocator *pApp_00;
  sqlite3 *in_stack_fffffffffffffe80;
  scalar_sqlite_udf_t in_stack_fffffffffffffe88;
  string local_118 [56];
  ulong local_e0;
  undefined1 local_d1 [105];
  undefined4 local_68;
  allocator local_51;
  string local_50 [32];
  long local_30;
  int local_1c;
  int local_4;
  
  LVar2 = (LogicalTypeId)((ulong)in_stack_fffffffffffffe68 >> 0x38);
  if ((((in_R9 == 0) && (in_stack_00000008 == 0)) && (in_stack_00000010 == 0)) ||
     ((in_RSI == (LogicalType *)0x0 || (in_EDX < -1)))) {
    local_4 = 0x15;
  }
  else {
    pApp_00 = &local_51;
    local_30 = in_R9;
    local_1c = in_EDX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,(char *)in_RSI,pApp_00);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    if (local_30 == 0) {
      local_4 = 0x15;
      local_68 = 1;
    }
    else {
      duckdb::SQLiteUDFWrapper::CreateSQLiteScalarFunction
                (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,pApp_00);
      duckdb::LogicalType::LogicalType(in_RSI,LVar2);
      if (local_1c == -1) {
        duckdb::LogicalType::LogicalType(in_RSI,LVar2);
        duckdb::LogicalType::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        duckdb::LogicalType::~LogicalType((LogicalType *)0x20e4f8);
        local_1c = 0;
      }
      this = (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             (long)local_1c;
      puVar1 = local_d1;
      std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x20e56f);
      duckdb::vector<duckdb::LogicalType,_true>::vector
                ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe50,
                 (size_type)in_stack_fffffffffffffe48,(allocator_type *)0x20e586);
      std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x20e595);
      for (local_e0 = 0; LVar2 = (LogicalTypeId)((ulong)puVar1 >> 0x38),
          local_e0 < (ulong)(long)local_1c; local_e0 = local_e0 + 1) {
        duckdb::LogicalType::LogicalType(in_RSI,LVar2);
        in_stack_fffffffffffffe58 =
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             duckdb::vector<duckdb::LogicalType,_true>::operator[]
                       ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe50,
                        (size_type)in_stack_fffffffffffffe48);
        duckdb::LogicalType::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        duckdb::LogicalType::~LogicalType((LogicalType *)0x20e609);
      }
      std::__cxx11::string::string(local_118,local_50);
      duckdb::vector<duckdb::LogicalType,_true>::vector
                ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe50,
                 (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe48);
      duckdb::LogicalType::LogicalType(in_RSI,LVar2);
      std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      function(this,in_stack_fffffffffffffe58);
      this_00 = duckdb::
                unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
                operator->((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>
                            *)in_stack_fffffffffffffe50);
      other = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*(&this_00->context);
      duckdb::LogicalType::LogicalType((LogicalType *)this_00,(LogicalType *)other);
      duckdb::UDFWrapper::RegisterFunction
                (in_stack_00000360,in_stack_00000358,in_stack_00000350,in_stack_00000348,
                 in_stack_00000340,in_stack_00000338);
      duckdb::LogicalType::~LogicalType((LogicalType *)0x20e747);
      std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *
                )0x20e751);
      duckdb::LogicalType::~LogicalType((LogicalType *)0x20e75b);
      duckdb::vector<duckdb::LogicalType,_true>::~vector
                ((vector<duckdb::LogicalType,_true> *)0x20e768);
      std::__cxx11::string::~string(local_118);
      local_4 = 0;
      local_68 = 1;
      duckdb::vector<duckdb::LogicalType,_true>::~vector
                ((vector<duckdb::LogicalType,_true> *)0x20e798);
      duckdb::LogicalType::~LogicalType((LogicalType *)0x20e7a5);
      std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *
                )0x20e7b2);
    }
    std::__cxx11::string::~string(local_50);
  }
  return local_4;
}

Assistant:

int sqlite3_create_function(sqlite3 *db, const char *zFunctionName, int nArg, int eTextRep, void *pApp,
                            void (*xFunc)(sqlite3_context *, int, sqlite3_value **),
                            void (*xStep)(sqlite3_context *, int, sqlite3_value **),
                            void (*xFinal)(sqlite3_context *)) {
	if ((!xFunc && !xStep && !xFinal) || !zFunctionName || nArg < -1) {
		return SQLITE_MISUSE;
	}
	string fname = string(zFunctionName);

	// Scalar function
	if (!xFunc) {
		return SQLITE_MISUSE;
	}
	auto udf_sqlite3 = SQLiteUDFWrapper::CreateSQLiteScalarFunction(xFunc, db, pApp);
	LogicalType varargs = LogicalType::INVALID;
	if (nArg == -1) {
		varargs = LogicalType::ANY;
		nArg = 0;
	}

	duckdb::vector<LogicalType> argv_types(nArg);
	for (idx_t i = 0; i < (idx_t)nArg; ++i) {
		argv_types[i] = LogicalType::ANY;
	}

	UDFWrapper::RegisterFunction(fname, argv_types, LogicalType::VARCHAR, udf_sqlite3, *(db->con->context), varargs);
	return SQLITE_OK;
}